

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::RemoveDefineFlag(cmMakefile *this,string *flag)

{
  bool bVar1;
  ulong uVar2;
  string *flag_local;
  cmMakefile *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    s_RemoveDefineFlag(flag,&this->DefineFlagsOrig);
    bVar1 = ParseDefineFlag(this,flag,true);
    if (!bVar1) {
      s_RemoveDefineFlag(flag,&this->DefineFlags);
    }
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefineFlag(std::string const& flag)
{
  // Check the length of the flag to remove.
  if (flag.empty()) {
    return;
  }

  // Update the string used for the old DEFINITIONS property.
  s_RemoveDefineFlag(flag, this->DefineFlagsOrig);

  // If this is really a definition, update COMPILE_DEFINITIONS.
  if (this->ParseDefineFlag(flag, true)) {
    return;
  }

  // Remove this flag that does not look like a definition.
  s_RemoveDefineFlag(flag, this->DefineFlags);
}